

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.cpp
# Opt level: O0

TRIPLERGB **
decimationAndRecovering
          (TRIPLERGB **mrx,BITMAPFILEHEADER bmFile,BITMAPINFOHEADER bmInfo,int decimation,int k,
          char *filenameDecimate,char *filenameRecover)

{
  BITMAPINFOHEADER bmInfo_00;
  BITMAPINFOHEADER bmInfo_01;
  BITMAPINFOHEADER bmInfo_02;
  BITMAPFILEHEADER bmFile_00;
  BITMAPFILEHEADER bmFile_01;
  TRIPLERGB **ppTVar1;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  uint local_f8;
  uint uStack_f4;
  BITMAPFILEHEADER local_f0;
  TRIPLERGB **mrxRecov;
  TRIPLERGB **mrxDecimat;
  BITMAPINFOHEADER bmInfoDecimat;
  BITMAPFILEHEADER bmFileDecimat;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  TRIPLERGB **local_40;
  undefined1 local_38 [16];
  char *filenameDecimate_local;
  int k_local;
  int decimation_local;
  TRIPLERGB **mrx_local;
  BITMAPFILEHEADER bmFile_local;
  
  bmFile_local._0_8_ = bmFile._8_8_;
  mrx_local = bmFile._0_8_;
  local_38._8_8_ = filenameDecimate;
  filenameDecimate_local._0_4_ = k;
  filenameDecimate_local._4_4_ = decimation;
  _k_local = mrx;
  if (decimation == 0) {
    local_40 = mrx_local;
    local_38._0_8_ = bmFile_local._0_8_;
    memcpy(&local_68,&bmInfo,0x28);
    bmFile_01.bfReserved1 = local_38._0_2_;
    bmFile_01.bfReserved2 = local_38._2_2_;
    bmFile_01.bfOffBits = local_38._4_4_;
    bmFile_01._0_8_ = local_40;
    bmInfo_00.biHeight = (undefined4)uStack_60;
    bmInfo_00.biPlanes = uStack_60._4_2_;
    bmInfo_00.biBitCount = uStack_60._6_2_;
    bmInfo_00.biSize = (undefined4)local_68;
    bmInfo_00.biWidth = local_68._4_4_;
    bmInfo_00.biCompression = (undefined4)local_58;
    bmInfo_00.biSizeImage = local_58._4_4_;
    bmInfo_00.biXPelsPerMeter = (undefined4)uStack_50;
    bmInfo_00.biYPelsPerMeter = uStack_50._4_4_;
    bmInfo_00.biClrUsed = (undefined4)local_48;
    bmInfo_00.biClrImportant = local_48._4_4_;
    decimationEjection(bmFile_01,bmInfo_00,_k_local,(int)filenameDecimate_local,
                       (char *)local_38._8_8_);
  }
  else if (decimation == 1) {
    memcpy(&bmFileDecimat.bfReserved1,&bmInfo,0x28);
    bmInfo_01._8_8_ = uStack_98;
    bmInfo_01._0_8_ = bmFileDecimat._8_8_;
    bmInfo_01._16_8_ = local_90;
    bmInfo_01._24_8_ = uStack_88;
    bmInfo_01._32_8_ = local_80;
    decimationMean(bmFile,bmInfo_01,_k_local,(int)filenameDecimate_local,(char *)local_38._8_8_);
  }
  mrxRecov = loadBMPFile((BITMAPFILEHEADER *)&bmInfoDecimat.biClrUsed,
                         (BITMAPINFOHEADER *)&mrxDecimat,(char *)local_38._8_8_);
  local_f8 = bmInfoDecimat.biClrUsed;
  uStack_f4 = bmInfoDecimat.biClrImportant;
  local_f0.bfType = bmFileDecimat.bfType;
  local_f0._2_2_ = bmFileDecimat._2_2_;
  local_f0.bfSize = bmFileDecimat.bfSize;
  memcpy(&local_120,&mrxDecimat,0x28);
  bmFile_00.bfReserved1 = local_f0.bfType;
  bmFile_00.bfReserved2 = local_f0._2_2_;
  bmFile_00.bfOffBits = local_f0.bfSize;
  bmFile_00._0_8_ = _local_f8;
  bmInfo_02.biHeight = (undefined4)uStack_118;
  bmInfo_02.biPlanes = uStack_118._4_2_;
  bmInfo_02.biBitCount = uStack_118._6_2_;
  bmInfo_02.biSize = (undefined4)local_120;
  bmInfo_02.biWidth = local_120._4_4_;
  bmInfo_02.biCompression = (undefined4)local_110;
  bmInfo_02.biSizeImage = local_110._4_4_;
  bmInfo_02.biXPelsPerMeter = (undefined4)uStack_108;
  bmInfo_02.biYPelsPerMeter = uStack_108._4_4_;
  bmInfo_02.biClrUsed = (undefined4)local_100;
  bmInfo_02.biClrImportant = local_100._4_4_;
  ppTVar1 = recovery(bmFile_00,bmInfo_02,mrxRecov,(int)filenameDecimate_local,filenameRecover);
  return ppTVar1;
}

Assistant:

TRIPLERGB **decimationAndRecovering(TRIPLERGB **mrx, BITMAPFILEHEADER bmFile, BITMAPINFOHEADER bmInfo,
                                    int decimation, int k, const char *filenameDecimate, const char *filenameRecover) {
    switch (decimation) {
        case DECIMATION_EJECT:
            decimationEjection(bmFile, bmInfo, mrx, k, filenameDecimate);
            break;
        case DECIMATION_MEAN:
            decimationMean(bmFile, bmInfo, mrx, k, filenameDecimate);
            break;
        default:
            break;
    }

    BITMAPFILEHEADER bmFileDecimat;
    BITMAPINFOHEADER bmInfoDecimat;
    TRIPLERGB **mrxDecimat = loadBMPFile(&bmFileDecimat, &bmInfoDecimat, filenameDecimate);
    TRIPLERGB **mrxRecov = recovery(bmFileDecimat, bmInfoDecimat, mrxDecimat, k, filenameRecover);

    //cout << "-------------------------------------\n";
    return mrxRecov;
}